

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapyRateTest.cpp
# Opt level: O0

void runRateTestStreamLoop
               (Device *device,Stream *stream,int direction,size_t numChans,size_t elemSize)

{
  undefined8 uVar1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  reference ppvVar6;
  ostream *poVar7;
  void **ppvVar8;
  ulong in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double sampleRate;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_> timePassed;
  longlong timeNs_1;
  int flags_1;
  size_t chanMask;
  time_point now;
  longlong timeNs;
  int flags;
  int ret;
  int spinIndex;
  time_point timeLastStatus;
  time_point timeLastSpin;
  time_point timeLastPrint;
  time_point startTime;
  unsigned_long_long totalSamples;
  uint underflows;
  uint overflows;
  size_t i;
  vector<void_*,_std::allocator<void_*>_> buffs;
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  buffMem;
  size_t numElems;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffdb8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffdc0;
  allocator_type *in_stack_fffffffffffffdc8;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde7;
  duration<long,_std::ratio<1L,_1000000L>_> local_158;
  int local_14c;
  duration<long,std::ratio<1l,1l>> local_148 [8];
  duration local_140;
  undefined1 local_138 [12];
  undefined1 local_12c [4];
  undefined1 local_128 [12];
  int local_11c;
  duration<long,std::ratio<1l,1l>> local_118 [8];
  duration local_110;
  int local_104;
  duration<long,std::ratio<1l,1000l>> local_100 [8];
  duration local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  long local_b0;
  uint local_a8;
  uint local_a4;
  size_type local_a0;
  vector<void_*,_std::allocator<void_*>_> local_90;
  allocator<char> local_61 [25];
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  local_48;
  undefined8 local_30;
  undefined8 local_28;
  ulong local_20;
  int local_14;
  undefined8 local_10;
  long *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = (**(code **)(*in_RDI + 0x78))(in_RDI,in_RSI);
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
             ,(allocator_type *)in_stack_fffffffffffffdd0.__r);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x1132c4);
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),
           in_stack_fffffffffffffdd8,(value_type *)in_stack_fffffffffffffdd0.__r,
           in_stack_fffffffffffffdc8);
  std::allocator<std::vector<char,_std::allocator<char>_>_>::~allocator
            ((allocator<std::vector<char,_std::allocator<char>_>_> *)0x1132f8);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdd0.__r);
  std::allocator<char>::~allocator(local_61);
  std::allocator<void_*>::allocator((allocator<void_*> *)0x113337);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             CONCAT17(in_stack_fffffffffffffde7,in_stack_fffffffffffffde0),in_stack_fffffffffffffdd8
             ,(allocator_type *)in_stack_fffffffffffffdd0.__r);
  std::allocator<void_*>::~allocator((allocator<void_*> *)0x113363);
  for (local_a0 = 0; local_a0 < local_20; local_a0 = local_a0 + 1) {
    std::
    vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
    ::operator[](&local_48,local_a0);
    pcVar5 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x1133a2);
    ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&local_90,local_a0);
    *ppvVar6 = pcVar5;
  }
  local_a4 = 0;
  local_a8 = 0;
  local_b0 = 0;
  local_b8 = std::chrono::_V2::system_clock::now();
  local_c0 = std::chrono::_V2::system_clock::now();
  local_c8 = std::chrono::_V2::system_clock::now();
  local_d0 = std::chrono::_V2::system_clock::now();
  local_d4 = 0;
  poVar7 = std::operator<<((ostream *)&std::cout,"Starting stream loop, press Ctrl+C to exit...");
  std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  (**(code **)(*local_8 + 0x80))(local_8,local_10,0,0);
  signal(2,sigIntHandler);
LAB_00113527:
  do {
    do {
      plVar2 = local_8;
      uVar1 = local_10;
      if (loopDone != 0) {
LAB_00113b75:
        (**(code **)(*local_8 + 0x88))(local_8,local_10,0,0);
        std::vector<void_*,_std::allocator<void_*>_>::~vector
                  ((vector<void_*,_std::allocator<void_*>_> *)in_stack_fffffffffffffdd0.__r);
        std::
        vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
        ::~vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffdd0.__r);
        return;
      }
      local_d8 = 0;
      local_dc = 0;
      local_e8 = 0;
      if (local_14 == 0) {
        ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::data
                            ((vector<void_*,_std::allocator<void_*>_> *)0x11365b);
        in_stack_fffffffffffffdb8 = (duration<long,_std::ratio<1L,_1000000000L>_> *)0x186a0;
        local_d8 = (**(code **)(*plVar2 + 0x98))(plVar2,uVar1,ppvVar8,local_30,&local_dc,local_e8);
      }
      else if (local_14 == 1) {
        ppvVar8 = std::vector<void_*,_std::allocator<void_*>_>::data
                            ((vector<void_*,_std::allocator<void_*>_> *)0x1135da);
        in_stack_fffffffffffffdb8 = (duration<long,_std::ratio<1L,_1000000000L>_> *)0x186a0;
        local_d8 = (**(code **)(*plVar2 + 0x90))(plVar2,uVar1,ppvVar8,local_30,&local_dc,&local_e8);
      }
    } while (local_d8 == -1);
    if (local_d8 != -4) {
      if (local_d8 == -7) {
        local_a8 = local_a8 + 1;
      }
      else {
        if (local_d8 < 0) {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Unexpected stream error ");
          pcVar5 = (char *)SoapySDR::errToStr(local_d8);
          poVar7 = std::operator<<(poVar7,pcVar5);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          goto LAB_00113b75;
        }
        local_b0 = local_b0 + local_d8;
        local_f0 = std::chrono::_V2::system_clock::now();
        local_104 = 300;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_100,&local_104);
        local_f8.__r = (rep)std::chrono::operator+
                                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)in_stack_fffffffffffffdc8,
                                       (duration<long,_std::ratio<1L,_1000L>_> *)
                                       in_stack_fffffffffffffdc0);
        bVar3 = std::chrono::operator<
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffdd0.__r,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffdc8);
        if (bVar3) {
          local_c8 = local_f0;
          iVar4 = local_d4 % 4;
          local_d4 = local_d4 + 1;
          printf("\b%c",(ulong)(uint)(int)"|/-\\"[iVar4]);
          fflush(_stdout);
        }
        local_11c = 1;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_118,&local_11c);
        local_110.__r =
             (rep)std::chrono::operator+
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffdc8,
                             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffdc0);
        bVar3 = std::chrono::operator<
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffdd0.__r,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffdc8);
        if (bVar3) {
          local_d0 = local_f0;
          do {
            while( true ) {
              while (local_d8 = (**(code **)(*local_8 + 0xa0))
                                          (local_8,local_10,local_128,local_12c,local_138,0),
                    local_d8 == -4) {
                local_a4 = local_a4 + 1;
              }
              if (local_d8 != -7) break;
              local_a8 = local_a8 + 1;
            }
          } while (local_d8 == -6);
        }
        local_14c = 5;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_148,&local_14c);
        local_140.__r =
             (rep)std::chrono::operator+
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)in_stack_fffffffffffffdc8,
                             (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffdc0);
        bVar3 = std::chrono::operator<
                          ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffdd0.__r,
                           (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            *)in_stack_fffffffffffffdc8);
        if (bVar3) {
          local_c0 = local_f0;
          std::chrono::operator-
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
          in_stack_fffffffffffffdd0 =
               std::chrono::
               duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                         (in_stack_fffffffffffffdb8);
          auVar9._8_4_ = (int)((ulong)local_b0 >> 0x20);
          auVar9._0_8_ = local_b0;
          auVar9._12_4_ = 0x45300000;
          in_stack_fffffffffffffdc0 =
               (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_b0) - 4503599627370496.0));
          local_158.__r = in_stack_fffffffffffffdd0.__r;
          in_stack_fffffffffffffdc8 =
               (allocator_type *)
               std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_158);
          auVar10._8_4_ = (int)(local_20 >> 0x20);
          auVar10._0_8_ = local_20;
          auVar10._12_4_ = 0x45300000;
          auVar11._8_4_ = (int)((ulong)local_28 >> 0x20);
          auVar11._0_8_ = local_28;
          auVar11._12_4_ = 0x45300000;
          printf("\b%g Msps\t%g MBps",
                 (double)in_stack_fffffffffffffdc0 / (double)(long)in_stack_fffffffffffffdc8,
                 ((double)in_stack_fffffffffffffdc0 / (double)(long)in_stack_fffffffffffffdc8) *
                 ((auVar10._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_20) - 4503599627370496.0)) *
                 ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0)));
          if (local_a4 != 0) {
            printf("\tOverflows %u",(ulong)local_a4);
          }
          if (local_a8 != 0) {
            printf("\tUnderflows %u",(ulong)local_a8);
          }
          printf("\n ");
        }
      }
      goto LAB_00113527;
    }
    local_a4 = local_a4 + 1;
  } while( true );
}

Assistant:

void runRateTestStreamLoop(
    SoapySDR::Device *device,
    SoapySDR::Stream *stream,
    const int direction,
    const size_t numChans,
    const size_t elemSize)
{
    //allocate buffers for the stream read/write
    const size_t numElems = device->getStreamMTU(stream);
    std::vector<std::vector<char>> buffMem(numChans, std::vector<char>(elemSize*numElems));
    std::vector<void *> buffs(numChans);
    for (size_t i = 0; i < numChans; i++) buffs[i] = buffMem[i].data();

    //state collected in this loop
    unsigned int overflows(0);
    unsigned int underflows(0);
    unsigned long long totalSamples(0);
    const auto startTime = std::chrono::high_resolution_clock::now();
    auto timeLastPrint = std::chrono::high_resolution_clock::now();
    auto timeLastSpin = std::chrono::high_resolution_clock::now();
    auto timeLastStatus = std::chrono::high_resolution_clock::now();
    int spinIndex(0);

    std::cout << "Starting stream loop, press Ctrl+C to exit..." << std::endl;
    device->activateStream(stream);
    signal(SIGINT, sigIntHandler);
    while (not loopDone)
    {
        int ret(0);
        int flags(0);
        long long timeNs(0);
        switch(direction)
        {
        case SOAPY_SDR_RX:
            ret = device->readStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        case SOAPY_SDR_TX:
            ret = device->writeStream(stream, buffs.data(), numElems, flags, timeNs);
            break;
        }

        if (ret == SOAPY_SDR_TIMEOUT) continue;
        if (ret == SOAPY_SDR_OVERFLOW)
        {
            overflows++;
            continue;
        }
        if (ret == SOAPY_SDR_UNDERFLOW)
        {
            underflows++;
            continue;
        }
        if (ret < 0)
        {
            std::cerr << "Unexpected stream error " << SoapySDR::errToStr(ret) << std::endl;
            break;
        }
        totalSamples += ret;

        const auto now = std::chrono::high_resolution_clock::now();
        if (timeLastSpin + std::chrono::milliseconds(300) < now)
        {
            timeLastSpin = now;
            static const char spin[] = {"|/-\\"};
            printf("\b%c", spin[(spinIndex++)%4]);
            fflush(stdout);
        }
        //occasionally read out the stream status (non blocking)
        if (timeLastStatus + std::chrono::seconds(1) < now)
        {
            timeLastStatus = now;
            while (true)
            {
                size_t chanMask; int flags; long long timeNs;
                ret = device->readStreamStatus(stream, chanMask, flags, timeNs, 0);
                if (ret == SOAPY_SDR_OVERFLOW) overflows++;
                else if (ret == SOAPY_SDR_UNDERFLOW) underflows++;
                else if (ret == SOAPY_SDR_TIME_ERROR) {}
                else break;
            }
        }
        if (timeLastPrint + std::chrono::seconds(5) < now)
        {
            timeLastPrint = now;
            const auto timePassed = std::chrono::duration_cast<std::chrono::microseconds>(now - startTime);
            const auto sampleRate = double(totalSamples)/timePassed.count();
            printf("\b%g Msps\t%g MBps", sampleRate, sampleRate*numChans*elemSize);
            if (overflows != 0) printf("\tOverflows %u", overflows);
            if (underflows != 0) printf("\tUnderflows %u", underflows);
            printf("\n ");
        }

    }
    device->deactivateStream(stream);
}